

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  Slice key;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  size_t sVar4;
  ssize_t sVar5;
  char *extraout_RDX;
  Slice local_80;
  Slice local_70;
  Status local_60;
  ssize_t local_58;
  char *local_50;
  Slice local_48;
  long local_38;
  ssize_t n;
  Slice k;
  ParsedInternalKey *ikey_local;
  DBIter *this_local;
  
  k.size_ = (size_t)ikey;
  iVar2 = (*this->iter_->_vptr_Iterator[8])();
  n = CONCAT44(extraout_var,iVar2);
  k.data_ = extraout_RDX;
  sVar3 = Slice::size((Slice *)&n);
  iVar2 = (*this->iter_->_vptr_Iterator[9])();
  local_48.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
  sVar4 = Slice::size(&local_48);
  local_38 = sVar3 + sVar4;
  this->bytes_counter_ = this->bytes_counter_ - local_38;
  while (this->bytes_counter_ < 0) {
    sVar5 = RandomPeriod(this);
    this->bytes_counter_ = sVar5 + this->bytes_counter_;
    local_58 = n;
    local_50 = k.data_;
    key.size_ = (size_t)k.data_;
    key.data_ = (char *)n;
    DBImpl::RecordReadSample(this->db_,key);
  }
  bVar1 = ParseInternalKey((Slice *)&n,(ParsedInternalKey *)k.size_);
  if (!bVar1) {
    Slice::Slice(&local_70,"corrupted internal key in DBIter");
    Slice::Slice(&local_80);
    Status::Corruption(&local_60,&local_70,&local_80);
    Status::operator=(&this->status_,&local_60);
    Status::~Status(&local_60);
  }
  return bVar1;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey *ikey) {
            Slice k = iter_->key();
            ssize_t n = k.size() + iter_->value().size();
            bytes_counter_ -= n;
            while (bytes_counter_ < 0) {
                bytes_counter_ += RandomPeriod();
                db_->RecordReadSample(k);
            }
            if (!ParseInternalKey(k, ikey)) {
                status_ = Status::Corruption("corrupted internal key in DBIter");
                return false;
            } else {
                return true;
            }
        }